

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O2

void Gia_ManCheckUnateVecTest(Gia_Man_t *p,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  abctime aVar5;
  Vec_Wec_t *p_00;
  void *__ptr;
  Vec_Int_t *pVVar6;
  abctime aVar7;
  uint i;
  ulong uVar8;
  int iVar9;
  int i_00;
  int iVar10;
  int i_01;
  bool bVar11;
  int local_5c;
  
  aVar5 = Abc_Clock();
  p_00 = Gia_ManCheckUnateVec(p,(Vec_Int_t *)0x0,(Vec_Int_t *)0x0);
  iVar9 = p->vCis->nSize;
  __ptr = calloc((long)iVar9 + 1,1);
  if (fVerbose != 0) {
    printf("Inputs  : ");
    iVar10 = 0;
    if (0 < iVar9) {
      iVar10 = iVar9;
    }
    uVar8 = 0;
    while( true ) {
      bVar11 = iVar10 == 0;
      iVar10 = iVar10 + -1;
      if (bVar11) break;
      printf("%d",uVar8 % 10);
      uVar8 = (ulong)((int)uVar8 + 1);
    }
    putchar(10);
  }
  i = 0;
  local_5c = 0;
  iVar10 = 0;
LAB_00609901:
  pVVar6 = p->vCos;
  if (pVVar6->nSize <= (int)i) {
    free(__ptr);
    iVar9 = 0x78e8d0;
    printf("Ins/Outs = %4d/%4d.  Total supp = %5d.  Total unate = %5d.\n",
           (ulong)(uint)p->vCis->nSize,(ulong)(uint)pVVar6->nSize,(ulong)(uint)(iVar10 + local_5c));
    Abc_Print(iVar9,"%s =","Total time");
    aVar7 = Abc_Clock();
    Abc_Print(iVar9,"%9.2f sec\n",(double)(aVar7 - aVar5) / 1000000.0);
    Vec_WecFree(p_00);
    return;
  }
  pVVar6 = Vec_WecEntry(p_00,i);
  memset(__ptr,0x20,(long)iVar9);
  i_01 = 0;
LAB_0060993e:
  do {
    if (pVVar6->nSize <= i_01) break;
    uVar1 = Vec_IntEntry(pVVar6,i_01);
    i_00 = i_01 + 1;
    if (i_00 < pVVar6->nSize) {
      iVar2 = Abc_Lit2Var(uVar1);
      iVar3 = Vec_IntEntry(pVVar6,i_00);
      iVar3 = Abc_Lit2Var(iVar3);
      if (iVar2 == iVar3) {
        uVar1 = Abc_Lit2Var(uVar1);
        *(undefined1 *)((long)__ptr + (ulong)uVar1) = 0x2e;
        iVar10 = iVar10 + 1;
        i_01 = i_01 + 2;
        goto LAB_0060993e;
      }
    }
    if ((int)uVar1 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
    uVar4 = Abc_Lit2Var(uVar1);
    *(char *)((long)__ptr + (ulong)uVar4) = ((uVar1 & 1) == 0) * '\x02' + 'n';
    local_5c = local_5c + 1;
    i_01 = i_00;
  } while( true );
  if (fVerbose != 0) {
    printf("Out%4d : %s\n",(ulong)i,__ptr);
  }
  i = i + 1;
  goto LAB_00609901;
}

Assistant:

void Gia_ManCheckUnateVecTest( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Vec_Wec_t * vUnates = Gia_ManCheckUnateVec( p, NULL, NULL );
    int i, o, Var, nVars = Gia_ManCiNum(p);
    int nUnate = 0, nNonUnate = 0;
    char * pBuffer = ABC_CALLOC( char, nVars+1 );
    if ( fVerbose )
    {
        printf( "Inputs  : " );
        for ( i = 0; i < nVars; i++ )
            printf( "%d", i % 10 );
        printf( "\n" );
    }
    for ( o = 0; o < Gia_ManCoNum(p); o++ )
    {
        Vec_Int_t * vUnate = Vec_WecEntry( vUnates, o );
        memset( pBuffer, ' ', (size_t)nVars );
        Vec_IntForEachEntry( vUnate, Var, i )
            if ( i+1 < Vec_IntSize(vUnate) && Abc_Lit2Var(Var) == Abc_Lit2Var(Vec_IntEntry(vUnate, i+1)) ) // both lits are present
                pBuffer[Abc_Lit2Var(Var)] = '.', i++, nNonUnate++; // does not depend on this var
            else
                pBuffer[Abc_Lit2Var(Var)] = Abc_LitIsCompl(Var) ? 'n' : 'p', nUnate++;
        if ( fVerbose )
            printf( "Out%4d : %s\n", o, pBuffer );
    }
    ABC_FREE( pBuffer );
    // print stats
    printf( "Ins/Outs = %4d/%4d.  Total supp = %5d.  Total unate = %5d.\n",
        Gia_ManCiNum(p), Gia_ManCoNum(p), nUnate+nNonUnate, nUnate );
    ABC_PRT( "Total time", Abc_Clock() - clk );
    //Vec_WecPrint( vUnates, 0 );
    Vec_WecFree( vUnates );
}